

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O2

ANNdist annBoxDistance(ANNpoint q,ANNpoint lo,ANNpoint hi,int dim,double *Scale,int *Topology)

{
  double dVar1;
  double dVar2;
  ANNcoord AVar3;
  ANNcoord AVar4;
  ANNcoord AVar5;
  ANNcoord AVar6;
  ANNcoord AVar7;
  ANNcoord AVar8;
  ANNcoord AVar9;
  ANNRectangle *this;
  int iVar10;
  int iVar11;
  ANNdist AVar12;
  ANNdist AVar13;
  ANNdist AVar14;
  double dVar15;
  double dVar16;
  
  AVar12 = 0.0;
  iVar11 = 0;
  do {
    if (dim <= iVar11) {
      return AVar12;
    }
    if (Topology[iVar11] == 3) {
      this = (ANNRectangle *)operator_new(0x40);
      AVar3 = hi[iVar11];
      AVar4 = lo[(long)iVar11 + 1];
      AVar5 = lo[(long)iVar11 + 2];
      AVar6 = hi[(long)iVar11 + 1];
      AVar7 = hi[(long)iVar11 + 2];
      iVar10 = iVar11 + 3;
      AVar8 = lo[(long)iVar11 + 3];
      AVar9 = hi[(long)iVar11 + 3];
      this->bnds1[0] = lo[iVar11];
      this->bnds1[1] = AVar3;
      this->bnds2[0] = AVar4;
      this->bnds2[1] = AVar6;
      this->bnds3[0] = AVar5;
      this->bnds3[1] = AVar7;
      this->bnds4[0] = AVar8;
      this->bnds4[1] = AVar9;
      AVar3 = q[iVar11];
      AVar4 = q[(long)iVar11 + 1];
      AVar5 = q[(long)iVar11 + 2];
      AVar6 = q[(long)iVar11 + 3];
      AVar13 = ANNRectangle::DistPointRectangle(this,AVar3,AVar4,AVar5,AVar6);
      AVar14 = ANNRectangle::DistPointRectangle(this,-AVar3,-AVar4,-AVar5,-AVar6);
      if (AVar13 <= AVar14) {
        AVar14 = AVar13;
      }
      AVar12 = AVar12 + AVar14;
      operator_delete(this);
    }
    else {
      iVar10 = iVar11;
      if (Topology[iVar11] == 2) {
        dVar1 = q[iVar11];
        dVar2 = lo[iVar11];
        if (dVar2 <= dVar1) {
          if (hi[iVar11] < dVar1) {
            dVar16 = dVar1 - hi[iVar11];
            dVar15 = Scale[iVar11] * 6.283185307179586 - ABS(dVar1 - dVar2);
            if (dVar16 <= dVar15) {
              dVar15 = dVar16;
            }
LAB_00105c49:
            AVar12 = AVar12 + dVar15 * dVar15;
          }
        }
        else {
          dVar15 = Scale[iVar11] * 6.283185307179586 - ABS(hi[iVar11] - dVar1);
          if (dVar2 - dVar1 <= dVar15) {
            dVar15 = dVar2 - dVar1;
          }
LAB_00105bf3:
          AVar12 = AVar12 + dVar15 * dVar15;
        }
      }
      else {
        dVar15 = q[iVar11];
        if (dVar15 < lo[iVar11]) {
          dVar15 = lo[iVar11] - dVar15;
          goto LAB_00105bf3;
        }
        if (hi[iVar11] < dVar15) {
          dVar15 = dVar15 - hi[iVar11];
          goto LAB_00105c49;
        }
      }
    }
    iVar11 = iVar10 + 1;
  } while( true );
}

Assistant:

ANNdist annBoxDistance(  // compute distance from point to box
    const ANNpoint q,    // the point
    const ANNpoint lo,   // low point of box
    const ANNpoint hi,   // high point of box
    int dim,             // dimension of space
    double *Scale,       // scaling coefficient
    int *Topology)       // topology of the space
{
    register ANNdist dist = 0.0;  // sum of squared distances
    register ANNdist t, t1;

    for (register int d = 0; d < dim; d++) {
        if (Topology[d] == 2) {
            if (q[d] < lo[d]) {  // q is left of box
                t = ANNdist(lo[d]) - ANNdist(q[d]);
                t1 = 2 * PI * Scale[d] - fabs(ANNdist(hi[d]) - ANNdist(q[d]));
                if (t1 < t) t = t1;
                dist = ANN_SUM(dist, ANN_POW(t));
            } else if (q[d] > hi[d]) {  // q is right of box
                t = ANNdist(q[d]) - ANNdist(hi[d]);
                t1 = 2 * PI * Scale[d] - fabs(ANNdist(q[d]) - ANNdist(lo[d]));
                if (t1 < t) t = t1;
                dist = ANN_SUM(dist, ANN_POW(t));
            }
        } else if (Topology[d] == 3) {
            register ANNRectangle *Rect =
                new ANNRectangle(lo[d], hi[d], lo[d + 1], hi[d + 1], lo[d + 2],
                                 hi[d + 2], lo[d + 3], hi[d + 3]);
            t = Rect->DistPointRectangle(q[d], q[d + 1], q[d + 2], q[d + 3]);
            t1 = Rect->DistPointRectangle(-q[d], -q[d + 1], -q[d + 2],
                                          -q[d + 3]);
            if (t1 < t) t = t1;
            dist = ANN_SUM(dist, t);

            delete Rect;
            d = d + 3;
        } else {
            if (q[d] < lo[d]) {  // q is left of box
                t = ANNdist(lo[d]) - ANNdist(q[d]);
                dist = ANN_SUM(dist, ANN_POW(t));
            } else if (q[d] > hi[d]) {  // q is right of box
                t = ANNdist(q[d]) - ANNdist(hi[d]);
                dist = ANN_SUM(dist, ANN_POW(t));
            }
        }
    }
    //    FLOP(4*dim)				// increment floating op count

    return dist;
}